

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerSafe::
RequestToken(std::function<void(std::vector<unsigned_char,std::allocator<unsigned_char>>const*,ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_short)
::$_0::~__0(__0 *this)

{
  std::__cxx11::string::~string((string *)(this + 0x28));
  std::_Function_base::~_Function_base((_Function_base *)(this + 8));
  return;
}

Assistant:

Error CommissionerSafe::RequestToken(ByteArray &aSignedToken, const std::string &aAddr, uint16_t aPort)
{
    std::promise<Error> pro;
    auto                wait = [&pro, &aSignedToken](const ByteArray *signedToken, Error error) {
        if (signedToken != nullptr)
        {
            aSignedToken = *signedToken;
        }
        pro.set_value(error);
    };

    RequestToken(wait, aAddr, aPort);
    return pro.get_future().get();
}